

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.cc
# Opt level: O3

bool __thiscall draco::PointCloud::DeduplicateAttributeValues(PointCloud *this)

{
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> this_00;
  bool bVar1;
  ValueType VVar2;
  pointer puVar3;
  long lVar4;
  
  bVar1 = true;
  if ((this->num_points_ != 0) &&
     (puVar3 = (this->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     0 < (int)((ulong)((long)(this->attributes_).
                             super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3) >> 3))) {
    lVar4 = 0;
    do {
      this_00._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           puVar3[lVar4]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      VVar2 = PointAttribute::DeduplicateValues
                        ((PointAttribute *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,
                         (GeometryAttribute *)
                         this_00._M_t.
                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
      bVar1 = VVar2 != 0;
      if (VVar2 == 0) {
        return bVar1;
      }
      lVar4 = lVar4 + 1;
      puVar3 = (this->attributes_).
               super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 < (int)((ulong)((long)(this->attributes_).
                                         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3)
                          >> 3));
  }
  return bVar1;
}

Assistant:

bool PointCloud::DeduplicateAttributeValues() {
  // Go over all attributes and create mapping between duplicate entries.
  if (num_points() == 0) {
    return true;  // Nothing to deduplicate.
  }
  // Deduplicate all attributes.
  for (int32_t att_id = 0; att_id < num_attributes(); ++att_id) {
    if (!attribute(att_id)->DeduplicateValues(*attribute(att_id))) {
      return false;
    }
  }
  return true;
}